

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.cpp
# Opt level: O3

optional<(anonymous_namespace)::ParseFunctionResult> *
anon_unknown.dwarf_ee00d::parseFunction
          (optional<(anonymous_namespace)::ParseFunctionResult> *__return_storage_ptr__,
          const_iterator *iBegin,const_iterator *iEnd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *functionNames,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argNames,size_t argCount)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  char *__s2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  const_iterator cVar9;
  optional<(anonymous_namespace)::ParseFunctionResult> *poVar10;
  optional<(anonymous_namespace)::ParseFunctionResult> *extraout_RAX;
  optional<(anonymous_namespace)::ParseFunctionResult> *extraout_RAX_00;
  const_reference pvVar11;
  const_iterator cVar12;
  const_iterator cVar13;
  ulong uVar14;
  _Base_ptr p_Var15;
  optional<(anonymous_namespace)::ParseFunctionResult> *extraout_RAX_01;
  Exception *pEVar16;
  size_t *psVar17;
  _Rb_tree_color _Var18;
  pointer pbVar19;
  _Base_ptr p_Var20;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  string currentArgName;
  optional<boost::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  r;
  const_iterator local_160;
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  undefined1 uStack_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_d8;
  _Base_ptr local_a8;
  size_t local_a0;
  char *local_98;
  const_iterator *pcStack_90;
  char *local_88;
  void *pvStack_80;
  iterator local_78;
  variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvStack_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_68;
  char local_38;
  
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_f8.
  super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  .
  super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  .
  super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  .
  super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  .
  super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  ._M_u._M_first._M_storage = (_Uninitialized<long,_true>)0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl._0_8_ = (_Base_ptr)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (pointer)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_98 = (char *)0x0;
  pcStack_90 = (const_iterator *)0x0;
  local_88 = (char *)0x0;
  pvStack_80 = (void *)0x0;
  local_78._M_current =
       (variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  pvStack_70 = (variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x0;
  local_f8.
  super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  .
  super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  .
  super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  .
  super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  .
  super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  ._M_u._8_8_ = (void *)0x0;
  local_f8.
  super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  .
  super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  .
  super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  .
  super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  .
  super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
  ._16_8_ = (_Base_ptr)0x0;
  _uStack_e0 = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_38 = '\x01';
  local_128._16_8_ = argNames;
  local_128._24_8_ = __return_storage_ptr__;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a0 = argCount;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~_Rb_tree(&local_d8);
  if ((void *)local_f8.
              super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
              .
              super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
              .
              super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
              .
              super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
              .
              super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
              ._M_u._8_8_ != (void *)0x0) {
    operator_delete((void *)local_f8.
                            super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            .
                            super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                            .
                            super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                            .
                            super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                            .
                            super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                            .
                            super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                            ._M_u._8_8_,
                    _uStack_e0 -
                    local_f8.
                    super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                    .
                    super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                    .
                    super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                    .
                    super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                    .
                    super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                    ._M_u._8_8_);
  }
  pbVar19 = (functionNames->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (functionNames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar19 != pbVar2) {
    cVar12 = (const_iterator)iEnd->_M_current;
    do {
      __s2 = iBegin->_M_current;
      uVar14 = pbVar19->_M_string_length;
      if ((uVar14 <= (ulong)((long)cVar12._M_current - (long)__s2)) &&
         ((uVar14 == 0 || (iVar8 = bcmp((pbVar19->_M_dataplus)._M_p,__s2,uVar14), iVar8 == 0)))) {
        cVar9 = parseComment((const_iterator *)(__s2 + uVar14),iEnd);
        cVar12 = cVar9;
        if ((cVar9._M_current != iEnd->_M_current) &&
           (cVar12._M_current = iEnd->_M_current, *cVar9._M_current == '(')) {
          local_160._M_current = cVar9._M_current + 1;
          local_98 = iBegin->_M_current;
          local_138._0_8_ = local_128;
          local_138._8_8_ = 0;
          local_128[0] = 0;
          local_a8 = (_Base_ptr)(local_128._16_8_ + 8);
          bVar7 = true;
          bVar6 = true;
          bVar5 = false;
          bVar4 = true;
          pcStack_90 = (const_iterator *)(__s2 + uVar14);
          goto LAB_001275af;
        }
      }
      pbVar19 = pbVar19 + 1;
    } while (pbVar19 != pbVar2);
  }
  *(bool *)(local_128._24_8_ + 0x60) = false;
  poVar10 = (optional<(anonymous_namespace)::ParseFunctionResult> *)local_128._24_8_;
LAB_0012750e:
  if (local_38 == '\x01') {
    local_38 = 0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::~_Rb_tree(&local_68);
    poVar10 = extraout_RAX;
    if (pvStack_80 != (void *)0x0) {
      operator_delete(pvStack_80,(long)pvStack_70 - (long)pvStack_80);
      poVar10 = extraout_RAX_00;
    }
  }
  return poVar10;
LAB_001275af:
  do {
    local_160 = parseComment(local_160._M_current,iEnd);
    if (local_160._M_current == iEnd->_M_current) {
LAB_00127954:
      pEVar16 = (Exception *)__cxa_allocate_exception(0x60);
      local_108._0_8_ = &local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"");
      rlib::sequencer::MmlCompiler::Exception::Exception
                (pEVar16,functionCallError,&local_160,iEnd,(string *)local_108);
      __cxa_throw(pEVar16,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                  rlib::sequencer::MmlCompiler::Exception::~Exception);
    }
    if ((bVar4) && (*local_160._M_current == ')')) {
      local_88 = local_160._M_current + 1;
      *(bool *)(local_128._24_8_ + 0x60) = false;
      if (local_38 == '\x01') {
        (((_Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false> *)
         local_128._24_8_)->_M_payload).
        super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>.
        super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>._M_payload._M_value
        .next._M_current = local_88;
        (((_Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false> *)
         local_128._24_8_)->_M_payload).
        super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>.
        super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>._M_payload._M_value
        .functionName.first =
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_98;
        *(const_iterator **)
         ((long)&(((_Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false> *)
                  local_128._24_8_)->_M_payload).
                 super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                 .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                 _M_payload + 8) = pcStack_90;
        *(void **)&(((pointer)(local_128._24_8_ + 0x18))->
                   super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ).
                   super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   ._M_u = pvStack_80;
        *(variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          **)((long)&(((pointer)(local_128._24_8_ + 0x18))->
                     super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ).
                     super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     ._M_u + 8) = local_78._M_current;
        *(variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          **)&(((pointer)(local_128._24_8_ + 0x18))->
              super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ).
              super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
              .
              super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
              .
              super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
              .
              super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
              .
              super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
              ._M_index = pvStack_70;
        pvStack_80 = (void *)0x0;
        local_78._M_current =
             (variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x0;
        pvStack_70 = (variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)0x0;
        p_Var15 = (_Base_ptr)
                  ((long)&(((pointer)(local_128._24_8_ + 0x30))->
                          super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ).
                          super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                          .
                          super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                          .
                          super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                          .
                          super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                          .
                          super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                          ._M_u + 8);
        if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          *(undefined8 *)
           &(((pointer)(local_128._24_8_ + 0x30))->
            super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ).
            super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            ._M_index = 0;
          psVar17 = (size_t *)
                    &(((pointer)(local_128._24_8_ + 0x48))->
                     super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ).
                     super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     ._M_index;
          _Var18 = _S_red;
          p_Var20 = p_Var15;
        }
        else {
          psVar17 = &local_68._M_impl.super__Rb_tree_header._M_node_count;
          *(_Base_ptr *)
           &(((pointer)(local_128._24_8_ + 0x30))->
            super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ).
            super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            ._M_index = local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
          (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var15;
          *(size_t *)
           &(((pointer)(local_128._24_8_ + 0x48))->
            super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ).
            super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            ._M_index = local_68._M_impl.super__Rb_tree_header._M_node_count;
          local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          p_Var1 = &local_68._M_impl.super__Rb_tree_header;
          p_Var15 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var20 = local_68._M_impl.super__Rb_tree_header._M_header._M_right;
          _Var18 = local_68._M_impl.super__Rb_tree_header._M_header._M_color;
          local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        }
        *(_Base_ptr *)
         &(((pointer)(local_128._24_8_ + 0x48))->
          super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ).
          super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          .
          super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          .
          super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          .
          super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          .
          super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          ._M_u = p_Var15;
        *(_Base_ptr *)
         ((long)&(((pointer)(local_128._24_8_ + 0x48))->
                 super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ).
                 super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 ._M_u + 8) = p_Var20;
        *psVar17 = 0;
        *(_Rb_tree_color *)
         ((long)&(((pointer)(local_128._24_8_ + 0x30))->
                 super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ).
                 super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 ._M_u + 8) = _Var18;
        *(bool *)(local_128._24_8_ + 0x60) = true;
      }
      poVar10 = (optional<(anonymous_namespace)::ParseFunctionResult> *)local_128;
      if ((optional<(anonymous_namespace)::ParseFunctionResult> *)local_138._0_8_ !=
          (optional<(anonymous_namespace)::ParseFunctionResult> *)local_128) {
        operator_delete((void *)local_138._0_8_,CONCAT71(local_128._1_7_,local_128[0]) + 1);
        poVar10 = extraout_RAX_01;
      }
      goto LAB_0012750e;
    }
    if ((!bVar5) || (*local_160._M_current != ',')) {
      if (bVar6) break;
      goto LAB_001276e7;
    }
    local_160._M_current = local_160._M_current + 1;
    bVar7 = true;
    bVar6 = true;
    bVar5 = false;
    bVar4 = true;
  } while( true );
  if (((anonymous_namespace)::
       parseFunction(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,unsigned_long)
       ::re == '\0') &&
     (iVar8 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   parseFunction(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,unsigned_long)
                                   ::re), iVar8 != 0)) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex(&parseFunction::re,"^([a-zA-Z]\\w*)",0);
    __cxa_atexit(boost::
                 basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                 ~basic_regex,&parseFunction::re,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         parseFunction(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,unsigned_long)
                         ::re);
  }
  regexSearch((optional<boost::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_108,(const_iterator *)local_160._M_current,(const_iterator *)iEnd->_M_current
              ,&parseFunction::re);
  bVar3 = true;
  if ((char)local_d8._M_impl.super__Rb_tree_header._M_header._M_right == '\x01') {
    pvVar11 = boost::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_108,0);
    cVar12 = parseComment((const_iterator *)
                          (pvVar11->
                          super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ).second._M_current,iEnd);
    if (*cVar12._M_current == ':') {
      pvVar11 = boost::
                match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_108,0);
      boost::
      sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,pvVar11);
      std::__cxx11::string::operator=((string *)local_138,(string *)local_158);
      if ((mapped_type *)local_158._0_8_ != (mapped_type *)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      cVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_128._16_8_,(key_type *)local_138);
      if (cVar13._M_node == local_a8) {
        pEVar16 = (Exception *)__cxa_allocate_exception(0x60);
        local_158._0_8_ = local_158 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
        rlib::sequencer::MmlCompiler::Exception::Exception
                  (pEVar16,argumentUnknownError,&local_160,iEnd,(string *)local_158);
        __cxa_throw(pEVar16,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                    rlib::sequencer::MmlCompiler::Exception::~Exception);
      }
      local_160._M_current = cVar12._M_current + 1;
      bVar7 = true;
      bVar6 = false;
      bVar5 = false;
      bVar4 = false;
      bVar3 = false;
    }
  }
  if ((char)local_d8._M_impl.super__Rb_tree_header._M_header._M_right == '\x01') {
    local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)
         ((ulong)local_d8._M_impl.super__Rb_tree_header._M_header._M_right & 0xffffffffffffff00);
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_108);
  }
  if (bVar3) {
LAB_001276e7:
    if (!bVar7) goto LAB_00127954;
    rlib::sequencer::MmlCompiler::Util::parseWord
              ((optional<rlib::sequencer::MmlCompiler::Util::ParsedWord> *)local_108,&local_160,iEnd
              );
    if (uStack_e0 != '\x01') {
      pEVar16 = (Exception *)__cxa_allocate_exception(0x60);
      local_108._0_8_ = &local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"");
      rlib::sequencer::MmlCompiler::Exception::Exception
                (pEVar16,argumentError,&local_160,iEnd,(string *)local_108);
      __cxa_throw(pEVar16,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                  rlib::sequencer::MmlCompiler::Exception::~Exception);
    }
    if (local_f8.
        super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .
        super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
        .
        super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
        .
        super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
        .
        super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
        .
        super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
        ._M_u._8_1_ == '\0') {
      pEVar16 = (Exception *)__cxa_allocate_exception(0x60);
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
      rlib::sequencer::MmlCompiler::Exception::Exception
                (pEVar16,argumentError,&local_160,iEnd,(string *)local_158);
      __cxa_throw(pEVar16,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                  rlib::sequencer::MmlCompiler::Exception::~Exception);
    }
    local_160._M_current =
         (char *)local_f8.
                 super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .
                 super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 ._16_8_;
    if (local_138._8_8_ == 0) {
      if (local_78._M_current == pvStack_70) {
        std::
        vector<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,std::allocator<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>>
        ::
        _M_realloc_insert<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>
                  ((vector<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,std::allocator<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>>
                    *)&pvStack_80,local_78,
                   (variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_108);
      }
      else {
        *(_Uninitialized<long,_true> *)
         &((local_78._M_current)->
          super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ).
          super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          .
          super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          .
          super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          .
          super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          .
          super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          ._M_index = local_f8.
                      super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      .
                      super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                      .
                      super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                      .
                      super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                      .
                      super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                      .
                      super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                      ._M_u._M_first._M_storage;
        *(undefined4 *)
         &((local_78._M_current)->
          super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ).
          super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          .
          super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          .
          super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          .
          super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          .
          super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
          ._M_u = local_108._0_4_;
        *(undefined4 *)
         ((long)&((local_78._M_current)->
                 super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ).
                 super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 ._M_u + 4) = local_108._4_4_;
        *(undefined4 *)
         ((long)&((local_78._M_current)->
                 super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ).
                 super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 ._M_u + 8) = local_108._8_4_;
        *(undefined4 *)
         ((long)&((local_78._M_current)->
                 super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ).
                 super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                 ._M_u + 0xc) = local_108._12_4_;
        local_78._M_current = local_78._M_current + 1;
      }
      uVar14 = ((long)local_78._M_current - (long)pvStack_80 >> 3) * -0x5555555555555555;
      if (local_a0 <= uVar14 && uVar14 - local_a0 != 0) {
        pEVar16 = (Exception *)__cxa_allocate_exception(0x60);
        local_158._0_8_ = local_158 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
        rlib::sequencer::MmlCompiler::Exception::Exception
                  (pEVar16,argumentError,&local_160,iEnd,(string *)local_158);
        __cxa_throw(pEVar16,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                    rlib::sequencer::MmlCompiler::Exception::~Exception);
      }
    }
    else {
      local_158._0_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                         *)&local_68,(key_type *)local_138);
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&>
        ::_S_vtable._M_arr
        [(long)(char)local_f8.
                     super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .
                     super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                     ._M_u._M_first._M_storage._0_1_ + 1]._M_data)
                ((anon_class_8_1_8991fb9c *)local_158,
                 (variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_108);
      local_138._8_8_ = 0;
      *(char *)local_138._0_8_ = '\0';
    }
    bVar7 = false;
    bVar6 = false;
    bVar5 = true;
    bVar4 = true;
  }
  goto LAB_001275af;
}

Assistant:

auto parseFunction(
	const std::string::const_iterator& iBegin,
	const std::string::const_iterator& iEnd,
	const std::vector<std::string>& functionNames,				// 関数名
	const std::set<std::string>& argNames,						// 名前付き引数名(ココにない引数名はエラー)
	const size_t argCount = (std::numeric_limits<size_t>::max)()	// 名前ナシ引数数(ココを超える数の引数はエラー)
) {
	std::optional<ParseFunctionResult> result = ParseFunctionResult();

	const auto func = [&]()->std::optional<std::string::const_iterator> {
		struct R {
			PairIterator				functionName;	// 関数名
			std::string::const_iterator	next;			// 次の位置
		};
		for (auto& name : functionNames) {
			const auto r = isStartsWith(iBegin, iEnd, name);
			if (!r) continue;
			auto it = parseComment(*r, iEnd);		// コメントを読み飛ばす
			if (it == iEnd || *it != '(') continue;
			it++;
			result->functionName = { iBegin,*r };
			return it;
		}
		return std::nullopt;
	}();
	if (!func) return decltype(result)();		// 該当しなかった

	std::string currentArgName;
	union {									// 次トークン情報
		struct {
			uint16_t	rightParen : 1;		// )
			uint16_t	comma : 1;			// ,
			uint16_t	argName : 1;		// 引数名
			uint16_t	argValue : 1;		// 引数値
		};
		uint16_t		all = 0;
	}flags;
	flags.rightParen = true;
	flags.argName = true;
	flags.argValue = true;

	auto it = *func;
	while (true) {
		it = parseComment(it, iEnd);		// コメントを読み飛ばす
		if (it == iEnd) break;

		if (flags.rightParen && *it == ')') {		// )
			result->next = it + 1;						// 次の位置
			return result;								// 正常終了
		}

		if (flags.comma && *it == ',') {			// ,
			it++;
			flags.all = 0;
			flags.rightParen = true;
			flags.argName = true;
			flags.argValue = true;
			continue;
		}

		if (flags.argName) {		// 引数名
			static const auto re = regex(R"(^([a-zA-Z]\w*))");
			if (const auto r = regexSearch(it, iEnd, re)) {
				const auto next = parseComment((*r)[0].second, iEnd);			// コメントを読み飛ばす
				if (*next == ':') {													// ":" があれば引数名で確定
					currentArgName = (*r)[0].str();
					if (auto i = argNames.find(currentArgName); i == argNames.end()) {	// 引数名チェック
						throw MmlCompiler::Exception(MmlCompiler::Exception::Code::argumentUnknownError, it, iEnd);
					}
					it = next + 1;
					flags.all = 0;
					flags.argValue = true;
					continue;
				}
			}
		}

		if (flags.argValue) {		// 引数値

			if (auto r = MmlCompiler::Util::parseWord(it, iEnd)) {
				if (!r->word) {			// パースエラー
					throw MmlCompiler::Exception(MmlCompiler::Exception::Code::argumentError, it, iEnd);	// 文字列パースエラーとする
				}
				it = r->next;
				if (currentArgName.empty()) {
					result->argsList.emplace_back(std::move(*r->word));
					if (result->argsList.size() > argCount) {
						throw MmlCompiler::Exception(MmlCompiler::Exception::Code::argumentError, it, iEnd);	// 引数が多すぎる
					}
				} else {
					result->argsName[currentArgName] = std::move(*r->word);
					currentArgName.clear();
				}
				flags.all = 0;
				flags.rightParen = true;
				flags.comma = true;
				continue;
			}

			throw MmlCompiler::Exception(MmlCompiler::Exception::Code::argumentError, it, iEnd);
		}

		break;		// どれにも該当しないならエラー
	}
	throw MmlCompiler::Exception(MmlCompiler::Exception::Code::functionCallError, it, iEnd);
}